

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O0

void __thiscall
ThreadedReplayer::enqueue_parent_pipeline<ThreadedReplayer::DeferredComputeInfo>
          (ThreadedReplayer *this,DeferredComputeInfo *info,Hash h,
          unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
          *pipelines,
          unordered_map<unsigned_long,_ThreadedReplayer::DeferredComputeInfo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ThreadedReplayer::DeferredComputeInfo>_>_>
          *parents,unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *parsed_parents)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  undefined1 local_80 [8];
  PipelineWorkItem work_item;
  lock_guard<std::mutex> local_48;
  lock_guard<std::mutex> holder;
  bool is_outside_range;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *parsed_parents_local;
  unordered_map<unsigned_long,_ThreadedReplayer::DeferredComputeInfo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ThreadedReplayer::DeferredComputeInfo>_>_>
  *parents_local;
  unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
  *pipelines_local;
  Hash h_local;
  DeferredComputeInfo *info_local;
  ThreadedReplayer *this_local;
  
  if (h != 0) {
    pipelines_local =
         (unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
          *)h;
    h_local = (Hash)info;
    info_local = (DeferredComputeInfo *)this;
    sVar1 = std::
            unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
            ::count(pipelines,(key_type *)&pipelines_local);
    holder._M_device._7_1_ = sVar1 == 0;
    if (((bool)holder._M_device._7_1_) &&
       (sVar2 = std::
                unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                ::count(parsed_parents,(key_type *)&pipelines_local), sVar2 == 0)) {
      std::lock_guard<std::mutex>::lock_guard(&local_48,&this->hash_lock);
      sVar3 = std::
              unordered_map<unsigned_long,_ThreadedReplayer::DeferredComputeInfo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ThreadedReplayer::DeferredComputeInfo>_>_>
              ::count(parents,(key_type *)&pipelines_local);
      work_item.hash_map_entry._5_3_ = 0;
      work_item.hash_map_entry._4_1_ = sVar3 != 0;
      std::lock_guard<std::mutex>::~lock_guard(&local_48);
      if (work_item.hash_map_entry._4_4_ == 0) {
        PipelineWorkItem::PipelineWorkItem((PipelineWorkItem *)local_80);
        work_item.hash._4_4_ = *(undefined4 *)(h_local + 0x18);
        local_80 = (undefined1  [8])pipelines_local;
        work_item.index._0_1_ = 1;
        work_item.index._1_1_ = 1;
        work_item.tag = RESOURCE_DESCRIPTOR_SET_LAYOUT;
        work_item.hash._0_4_ = DeferredComputeInfo::get_tag();
        enqueue_work_item(this,(PipelineWorkItem *)local_80);
        std::
        unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
        ::insert(parsed_parents,(value_type *)&pipelines_local);
      }
    }
  }
  return;
}

Assistant:

void enqueue_parent_pipeline(const DerivedInfo &info, Hash h,
	                             const unordered_map<Hash, VkPipeline> &pipelines,
	                             unordered_map<Hash, DerivedInfo> &parents,
	                             unordered_set<Hash> &parsed_parents)
	{
		if (!h)
			return;

		// pipelines will have an entry if we called enqueue_pipeline() already for this hash,
		// it's not necessarily complete yet!
		bool is_outside_range = pipelines.count(h) == 0;

		if (is_outside_range && parsed_parents.count(h) == 0)
		{
			{
				lock_guard<mutex> holder(hash_lock);
				if (parents.count(h) != 0)
					return;
			}

			PipelineWorkItem work_item;
			work_item.index = info.index;
			work_item.hash = h;
			work_item.parse_only = true;
			work_item.force_outside_range = true;
			work_item.memory_context_index = PARENT_PIPELINE_MEMORY_CONTEXT;
			work_item.tag = DerivedInfo::get_tag();
			enqueue_work_item(work_item);

			parsed_parents.insert(h);
		}
	}